

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>
 __thiscall
mp::BasicExprFactory<std::allocator<char>>::
BeginIterated<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
          (BasicExprFactory<std::allocator<char>_> *this,Kind kind,int num_args)

{
  SafeInt<int> n;
  AssertionFailure *this_00;
  Impl *impl_00;
  int in_EDX;
  int in_ESI;
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>
  BVar1;
  Impl *impl;
  SafeInt<int> size;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  SafeInt<int> in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffc8;
  SafeInt<int> in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 local_10 [12];
  
  if (in_EDX < 0) {
    this_00 = (AssertionFailure *)__cxa_allocate_exception(0x10);
    AssertionFailure::AssertionFailure
              (this_00,(char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    __cxa_throw(this_00,&AssertionFailure::typeinfo,AssertionFailure::~AssertionFailure);
  }
  SafeInt<int>::SafeInt((SafeInt<int> *)&stack0xffffffffffffffd0,8);
  n = mp::operator*(in_stack_ffffffffffffffb0,in_ESI);
  mp::val(n);
  impl_00 = Allocate<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)47,(mp::expr::Kind)47>>
                      ((BasicExprFactory<std::allocator<char>_> *)
                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0.value_),
                       (Kind)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                       (int)in_stack_ffffffffffffffc8);
  impl_00->num_args = in_EDX;
  BasicExprFactory<std::allocator<char>_>::
  BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>
  ::BasicIteratedExprBuilder
            ((BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>
              *)local_10,impl_00);
  BVar1._12_4_ = 0;
  BVar1.impl_ = (Impl *)local_10._0_8_;
  BVar1.arg_index_ = local_10._8_4_;
  return BVar1;
}

Assistant:

BasicIteratedExprBuilder<ExprType> BeginIterated(
        expr::Kind kind, int num_args) {
    MP_ASSERT(num_args >= 0, "invalid number of arguments");
    SafeInt<int> size = sizeof(Expr::Impl*);
    typename ExprType::Impl *impl =
        Allocate<ExprType>(kind, val(size * (num_args - 1)));
    impl->num_args = num_args;
    return BasicIteratedExprBuilder<ExprType>(impl);
  }